

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch.hpp
# Opt level: O3

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpatch::detail::
from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (detail *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *source,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *target,
          string_view_type *path)

{
  undefined1 uVar1;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this_00;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  undefined1 auVar5 [8];
  size_t sVar6;
  size_t sVar7;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *target_00;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  byte bVar11;
  unsigned_long value;
  undefined1 auVar12 [8];
  array_range_type aVar13;
  array_range_type aVar14;
  array_range_type aVar15;
  const_object_iterator cVar16;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> bVar17;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> temp_diff;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> temp_diff_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val_4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val_2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_e8;
  byte local_d1;
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [16];
  undefined1 local_b0 [8];
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_88;
  undefined1 local_78 [24];
  string_view_type *local_60;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *local_58;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_50;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_48;
  string_view_type local_40;
  
  local_c8 = (undefined1  [8])0x0;
  auStack_c0._0_8_ = (pointer)0x0;
  auStack_c0._8_8_ = (pointer)0x0;
  local_60 = path;
  pvVar4 = operator_new(0x20);
  *(undefined1 (*) [8])((long)pvVar4 + 8) = local_c8;
  *(undefined8 *)((long)pvVar4 + 0x10) = auStack_c0._0_8_;
  *(undefined8 *)((long)pvVar4 + 0x18) = auStack_c0._8_8_;
  local_c8 = (undefined1  [8])0x0;
  auStack_c0._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  auStack_c0._8_8_ = (pointer)0x0;
  *(undefined2 *)this = 0xe;
  *(void **)(this + 8) = pvVar4;
  json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  ::flatten_and_destroy
            ((json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
              *)local_d0);
  std::
  vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
  ::~vector((vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
             *)local_c8);
  local_b0 = (undefined1  [8])target;
  iVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::compare
                    (source,target);
  auVar12 = local_b0;
  pbVar8 = source;
  pbVar10 = extraout_RDX;
  if (iVar3 != 0) {
    while (uVar9 = (byte)(pbVar8->field_0).json_ref_ & 0xf, uVar9 - 8 < 2) {
      pbVar8 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
                ((long)&pbVar8->field_0 + 8);
    }
    auVar5 = local_b0;
    local_58 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)source;
    if (uVar9 == 0xe) {
      while (((byte)*(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     auVar5 & 0xf) - 8 < 2) {
        auVar5 = (undefined1  [8])
                 *(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> **)
                  ((long)auVar5 + 8);
      }
      if (((byte)*(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)auVar5
          & 0xf) == 0xe) {
        sVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          (source);
        sVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)auVar12);
        if (sVar7 < sVar6) {
          sVar6 = sVar7;
        }
        if (sVar6 != 0) {
          value = 0;
          do {
            local_d0 = (undefined1  [8])auStack_c0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d0,local_60->_M_str,local_60->_M_str + local_60->_M_len);
            std::__cxx11::string::push_back
                      ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d0);
            jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                      (value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d0);
            pbVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                               ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                 *)local_58,value);
            target_00 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                        at((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)local_b0,value);
            local_f8._M_allocated_capacity = (size_type)local_c8;
            local_f8._8_8_ = local_d0;
            from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                      ((detail *)local_118,pbVar8,target_00,(string_view_type *)&local_f8);
            aVar13 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)this);
            aVar14 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)local_118);
            aVar15 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)local_118);
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                      ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)aVar13.last_._M_current,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )aVar14.first_._M_current,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )aVar15.last_._M_current);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )local_118);
            if (local_d0 != (undefined1  [8])auStack_c0) {
              operator_delete((void *)local_d0,(ulong)(auStack_c0._0_8_ + 1));
            }
            value = value + 1;
          } while (sVar6 != value);
        }
        sVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)local_58);
        while (sVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                       size((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)local_b0), sVar7 < sVar6) {
          local_d0 = (undefined1  [8])auStack_c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d0,local_60->_M_str,local_60->_M_str + local_60->_M_len);
          std::__cxx11::string::push_back
                    ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0);
          sVar6 = sVar6 - 1;
          jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                    (sVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0);
          local_78._8_8_ = operator_new(0x20);
          *(undefined8 *)(local_78._8_8_ + 8) = 0;
          *(undefined8 *)(local_78._8_8_ + 0x10) = 0;
          *(undefined8 *)(local_78._8_8_ + 0x18) = 0;
          local_78._0_2_ = 0xd;
          jsonpatch_names<char>::op_name_abi_cxx11_();
          local_88._0_8_ = local_118._8_8_;
          local_88.long_str_.ptr_ = (pointer)local_118._0_8_;
          jsonpatch_names<char>::remove_name_abi_cxx11_();
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert_or_assign<std::__cxx11::string>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)local_a8,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     local_78,(string_view_type *)&local_88.common_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8)
          ;
          if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
               *)local_f8._M_allocated_capacity != &local_e8) {
            operator_delete((void *)local_f8._M_allocated_capacity,(ulong)(local_e8._0_8_ + 1));
          }
          if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)local_118._0_8_ !=
              (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          jsonpatch_names<char>::path_name_abi_cxx11_();
          local_a8._0_8_ = local_118._8_8_;
          local_a8._8_8_ = local_118._0_8_;
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert_or_assign<std::__cxx11::string&>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)&local_f8,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     local_78,(string_view_type *)local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
          if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)local_118._0_8_ !=
              (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)local_78);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     local_78);
          if (local_d0 != (undefined1  [8])auStack_c0) {
            operator_delete((void *)local_d0,(ulong)(auStack_c0._0_8_ + 1));
          }
        }
        sVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)local_58);
        for (; sVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                       size((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)local_b0), pbVar10 = extraout_RDX_04, sVar6 < sVar7;
            sVar6 = sVar6 + 1) {
          pbVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                             ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                               *)local_b0,sVar6);
          local_d0 = (undefined1  [8])auStack_c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d0,local_60->_M_str,local_60->_M_str + local_60->_M_len);
          std::__cxx11::string::push_back
                    ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0);
          jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                    (sVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0);
          local_78._8_8_ = operator_new(0x20);
          *(undefined8 *)(local_78._8_8_ + 8) = 0;
          *(undefined8 *)(local_78._8_8_ + 0x10) = 0;
          *(undefined8 *)(local_78._8_8_ + 0x18) = 0;
          local_78._0_2_ = 0xd;
          jsonpatch_names<char>::op_name_abi_cxx11_();
          local_88._0_8_ = local_118._8_8_;
          local_88.long_str_.ptr_ = (pointer)local_118._0_8_;
          jsonpatch_names<char>::add_name_abi_cxx11_();
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert_or_assign<std::__cxx11::string>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)local_a8,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     local_78,(string_view_type *)&local_88.common_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8)
          ;
          if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
               *)local_f8._M_allocated_capacity != &local_e8) {
            operator_delete((void *)local_f8._M_allocated_capacity,(ulong)(local_e8._0_8_ + 1));
          }
          if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)local_118._0_8_ !=
              (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          jsonpatch_names<char>::path_name_abi_cxx11_();
          local_a8._0_8_ = local_118._8_8_;
          local_a8._8_8_ = local_118._0_8_;
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert_or_assign<std::__cxx11::string&>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)&local_f8,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     local_78,(string_view_type *)local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
          if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)local_118._0_8_ !=
              (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          jsonpatch_names<char>::value_name_abi_cxx11_();
          local_a8._0_8_ = local_118._8_8_;
          local_a8._8_8_ = local_118._0_8_;
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)&local_f8,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     local_78,(string_view_type *)local_a8,pbVar8);
          if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)local_118._0_8_ !=
              (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)local_78);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     local_78);
          if (local_d0 != (undefined1  [8])auStack_c0) {
            operator_delete((void *)local_d0,(ulong)(auStack_c0._0_8_ + 1));
          }
        }
        goto LAB_003990f0;
      }
    }
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      (source);
    if ((bVar2) &&
       (bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                is_object((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)auVar12), bVar2)) {
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                ((const_object_range_type *)local_d0,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)source);
      auVar12 = local_b0;
      uVar1 = auStack_c0[8];
      local_48 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)CONCAT71(local_48._1_7_,local_c8[0]);
      local_d1 = local_c8[0] & auStack_c0[8];
      local_50 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)auStack_c0._0_8_;
      bVar2 = local_c8[0] == (bool)auStack_c0[8];
      if ((local_d1 & 1) != 0) {
        bVar2 = local_d0 == (undefined1  [8])auStack_c0._0_8_;
      }
      if (!bVar2) {
        auVar5 = local_d0;
        do {
          local_118._0_8_ = local_118 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,local_60->_M_str,local_60->_M_str + local_60->_M_len);
          std::__cxx11::string::push_back
                    ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_118);
          jsonpointer::escape<std::__cxx11::string,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar5,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
          ;
          local_f8._8_8_ =
               (((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)auVar5)->key_)._M_dataplus._M_p;
          local_f8._M_allocated_capacity =
               (((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)auVar5)->key_)._M_string_length;
          cVar16 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                   find_abi_cxx11_((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                    *)auVar12,(string_view_type *)&local_f8);
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          object_range_abi_cxx11_
                    ((const_object_range_type *)&local_f8,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     auVar12);
          if ((((undefined1  [16])cVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
             ((local_e8.short_str_.data_[6] & 1U) == 0)) {
            if (cVar16.has_value_ != (bool)local_e8.short_str_.data_[6]) goto LAB_00398ab1;
LAB_00398b2b:
            local_88.long_str_.ptr_ = (pointer)operator_new(0x20);
            *(undefined8 *)
             &(((pointer)local_88.long_str_.ptr_)->
              super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 = 0;
            ((pointer)local_88.long_str_.ptr_)->p_ = (pointer)0x0;
            (local_88.byte_str_.ptr_)->length_ = 0;
            local_88.common_ = (common_storage)0xd;
            jsonpatch_names<char>::op_name_abi_cxx11_();
            local_40._M_len = local_f8._8_8_;
            local_40._M_str = (char *)local_f8._M_allocated_capacity;
            jsonpatch_names<char>::remove_name_abi_cxx11_();
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)local_78,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       &local_88.common_,&local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._0_8_ != &local_98) {
              operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
            }
            if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                 *)local_f8._M_allocated_capacity != &local_e8) {
              operator_delete((void *)local_f8._M_allocated_capacity,(ulong)(local_e8._0_8_ + 1));
            }
            jsonpatch_names<char>::path_name_abi_cxx11_();
            local_78._0_8_ = local_f8._8_8_;
            local_78._8_8_ = local_f8._M_allocated_capacity;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string&>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)local_a8,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       &local_88.common_,(string_view_type *)local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118);
            if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                 *)local_f8._M_allocated_capacity != &local_e8) {
              operator_delete((void *)local_f8._M_allocated_capacity,(ulong)(local_e8._0_8_ + 1));
            }
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                              *)&local_88.common_);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )&local_88.common_);
          }
          else {
            if (cVar16.it_._M_current._M_current ==
                (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)local_e8._0_8_) goto LAB_00398b2b;
LAB_00398ab1:
            local_a8._0_8_ = local_118._8_8_;
            local_a8._8_8_ = local_118._0_8_;
            from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                      ((detail *)local_f8._M_local_buf,
                       &((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                          *)auVar5)->value_,&(cVar16.it_._M_current._M_current)->value_,
                       (string_view_type *)local_a8);
            aVar13 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)this);
            aVar14 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)&local_f8);
            aVar15 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)&local_f8);
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                      ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)aVar13.last_._M_current,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )aVar14.first_._M_current,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )aVar15.last_._M_current);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )&local_f8);
          }
          if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)local_118._0_8_ !=
              (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          auVar5 = (undefined1  [8])((long)auVar5 + 0x30);
          bVar2 = auVar5 == (undefined1  [8])local_50;
          if ((local_d1 & 1) == 0) {
            bVar2 = (byte)local_48 == uVar1;
          }
        } while (!bVar2);
      }
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                ((const_object_range_type *)local_d0,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)local_b0
                );
      this_00 = local_58;
      local_b0[0] = local_c8[0];
      local_50 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)CONCAT71(local_50._1_7_,auStack_c0[8]);
      bVar11 = local_c8[0] & auStack_c0[8];
      local_48 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)auStack_c0._0_8_;
      bVar2 = local_c8[0] == (bool)auStack_c0[8];
      if ((bVar11 & 1) != 0) {
        bVar2 = local_d0 == (undefined1  [8])auStack_c0._0_8_;
      }
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                auStack_c0._0_8_;
      if (!bVar2) {
        auVar12 = local_d0;
        do {
          local_118._8_8_ =
               (((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)auVar12)->key_)._M_dataplus._M_p;
          local_118._0_8_ =
               (((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)auVar12)->key_)._M_string_length;
          cVar16 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                   find_abi_cxx11_(this_00,(string_view_type *)local_118);
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          object_range_abi_cxx11_((const_object_range_type *)local_118,this_00);
          if ((((undefined1  [16])cVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
             ((local_118[0x18] & 1) == 0)) {
            bVar2 = cVar16.has_value_ == (bool)local_118[0x18];
          }
          else {
            bVar2 = cVar16.it_._M_current._M_current ==
                    (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     *)local_118._16_8_;
          }
          pbVar10 = extraout_RDX_00;
          if (bVar2) {
            local_118._0_8_ = local_118 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_118,local_60->_M_str,local_60->_M_str + local_60->_M_len);
            std::__cxx11::string::push_back
                      ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_118);
            jsonpointer::escape<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar12,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118);
            local_88.long_str_.ptr_ = (pointer)operator_new(0x20);
            *(undefined8 *)
             &(((pointer)local_88.long_str_.ptr_)->
              super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 = 0;
            ((pointer)local_88.long_str_.ptr_)->p_ = (pointer)0x0;
            (local_88.byte_str_.ptr_)->length_ = 0;
            local_88.common_ = (common_storage)0xd;
            jsonpatch_names<char>::op_name_abi_cxx11_();
            local_40._M_len = local_f8._8_8_;
            local_40._M_str = (char *)local_f8._M_allocated_capacity;
            jsonpatch_names<char>::add_name_abi_cxx11_();
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)local_78,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       &local_88.common_,&local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._0_8_ != &local_98) {
              operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
            }
            if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                 *)local_f8._M_allocated_capacity != &local_e8) {
              operator_delete((void *)local_f8._M_allocated_capacity,(ulong)(local_e8._0_8_ + 1));
            }
            jsonpatch_names<char>::path_name_abi_cxx11_();
            local_78._0_8_ = local_f8._8_8_;
            local_78._8_8_ = local_f8._M_allocated_capacity;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string&>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)local_a8,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       &local_88.common_,(string_view_type *)local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118);
            if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                 *)local_f8._M_allocated_capacity != &local_e8) {
              operator_delete((void *)local_f8._M_allocated_capacity,(ulong)(local_e8._0_8_ + 1));
            }
            jsonpatch_names<char>::value_name_abi_cxx11_();
            local_78._0_8_ = local_f8._8_8_;
            local_78._8_8_ = local_f8._M_allocated_capacity;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)local_a8,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       &local_88.common_,(string_view_type *)local_78,
                       &((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                          *)auVar12)->value_);
            if ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                 *)local_f8._M_allocated_capacity != &local_e8) {
              operator_delete((void *)local_f8._M_allocated_capacity,(ulong)(local_e8._0_8_ + 1));
            }
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                              *)&local_88.common_);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )&local_88.common_);
            pbVar10 = extraout_RDX_01;
            if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)local_118._0_8_ !=
                (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)(local_118 + 0x10)) {
              operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
              pbVar10 = extraout_RDX_02;
            }
          }
          auVar12 = (undefined1  [8])((long)auVar12 + 0x30);
          bVar2 = auVar12 == (undefined1  [8])local_48;
          if ((bVar11 & 1) == 0) {
            bVar2 = local_b0[0] == (char)local_50;
          }
        } while (!bVar2);
      }
    }
    else {
      local_a8._8_8_ = operator_new(0x20);
      *(char *)(local_a8._8_8_ + 8) = '\0';
      *(char *)(local_a8._8_8_ + 9) = '\0';
      *(char *)(local_a8._8_8_ + 10) = '\0';
      *(char *)(local_a8._8_8_ + 0xb) = '\0';
      *(char *)(local_a8._8_8_ + 0xc) = '\0';
      *(char *)(local_a8._8_8_ + 0xd) = '\0';
      *(char *)(local_a8._8_8_ + 0xe) = '\0';
      *(char *)(local_a8._8_8_ + 0xf) = '\0';
      *(char *)(local_a8._8_8_ + 0x10) = '\0';
      *(char *)(local_a8._8_8_ + 0x11) = '\0';
      *(char *)(local_a8._8_8_ + 0x12) = '\0';
      *(char *)(local_a8._8_8_ + 0x13) = '\0';
      *(char *)(local_a8._8_8_ + 0x14) = '\0';
      *(char *)(local_a8._8_8_ + 0x15) = '\0';
      *(char *)(local_a8._8_8_ + 0x16) = '\0';
      *(char *)(local_a8._8_8_ + 0x17) = '\0';
      *(char *)(local_a8._8_8_ + 0x18) = '\0';
      *(char *)(local_a8._8_8_ + 0x19) = '\0';
      *(char *)(local_a8._8_8_ + 0x1a) = '\0';
      *(char *)(local_a8._8_8_ + 0x1b) = '\0';
      *(char *)(local_a8._8_8_ + 0x1c) = '\0';
      *(char *)(local_a8._8_8_ + 0x1d) = '\0';
      *(char *)(local_a8._8_8_ + 0x1e) = '\0';
      *(char *)(local_a8._8_8_ + 0x1f) = '\0';
      local_a8._0_2_ = 0xd;
      jsonpatch_names<char>::op_name_abi_cxx11_();
      local_78._0_8_ = local_c8;
      local_78._8_8_ = local_d0;
      jsonpatch_names<char>::replace_name_abi_cxx11_();
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      insert_or_assign<std::__cxx11::string>
                ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                  *)&local_f8,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)local_a8
                 ,(string_view_type *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
      if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_118._0_8_ !=
          (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
      }
      if (local_d0 != (undefined1  [8])auStack_c0) {
        operator_delete((void *)local_d0,(ulong)(auStack_c0._0_8_ + 1));
      }
      jsonpatch_names<char>::path_name_abi_cxx11_();
      local_f8._M_allocated_capacity = (size_type)local_c8;
      local_f8._8_8_ = local_d0;
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      insert_or_assign<std::basic_string_view<char,std::char_traits<char>>const&>
                ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                  *)local_118,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)local_a8
                 ,(string_view_type *)&local_f8,local_60);
      if (local_d0 != (undefined1  [8])auStack_c0) {
        operator_delete((void *)local_d0,(ulong)(auStack_c0._0_8_ + 1));
      }
      jsonpatch_names<char>::value_name_abi_cxx11_();
      local_f8._M_allocated_capacity = (size_type)local_c8;
      local_f8._8_8_ = local_d0;
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                  *)local_118,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)local_a8
                 ,(string_view_type *)&local_f8,
                 (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 auVar12);
      if (local_d0 != (undefined1  [8])auStack_c0) {
        operator_delete((void *)local_d0,(ulong)(auStack_c0._0_8_ + 1));
      }
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
                 (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 local_a8);
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 local_a8);
      pbVar10 = extraout_RDX_03;
    }
  }
LAB_003990f0:
  bVar17.field_0.int64_.val_ = (int64_t)pbVar10;
  bVar17.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>)bVar17.field_0;
}

Assistant:

Json from_diff(const Json& source, const Json& target, const typename Json::string_view_type& path)
    {
        using char_type = typename Json::char_type;

        Json result = typename Json::array();

        if (source == target)
        {
            return result;
        }

        if (source.is_array() && target.is_array())
        {
            std::size_t common = (std::min)(source.size(),target.size());
            for (std::size_t i = 0; i < common; ++i)
            {
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                auto temp_diff = from_diff(source[i],target[i],ss);
                result.insert(result.array_range().end(),temp_diff.array_range().begin(),temp_diff.array_range().end());
            }
            // Element in source, not in target - remove
            for (std::size_t i = source.size(); i-- > target.size();)
            {
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                Json val(json_object_arg);
                val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::remove_name());
                val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                result.push_back(std::move(val));
            }
            // Element in target, not in source - add, 
            // Fix contributed by Alexander rog13
            for (std::size_t i = source.size(); i < target.size(); ++i)
            {
                const auto& a = target[i];
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                Json val(json_object_arg);
                val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::add_name());
                val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                val.insert_or_assign(jsonpatch_names<char_type>::value_name(), a);
                result.push_back(std::move(val));
            }
        }
        else if (source.is_object() && target.is_object())
        {
            for (const auto& a : source.object_range())
            {
                std::basic_string<char_type> ss(path);
                ss.push_back('/'); 
                jsonpointer::escape(a.key(),ss);
                auto it = target.find(a.key());
                if (it != target.object_range().end())
                {
                    auto temp_diff = from_diff(a.value(),(*it).value(),ss);
                    result.insert(result.array_range().end(),temp_diff.array_range().begin(),temp_diff.array_range().end());
                }
                else
                {
                    Json val(json_object_arg);
                    val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::remove_name());
                    val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                    result.push_back(std::move(val));
                }
            }
            for (const auto& a : target.object_range())
            {
                auto it = source.find(a.key());
                if (it == source.object_range().end())
                {
                    std::basic_string<char_type> ss(path); 
                    ss.push_back('/');
                    jsonpointer::escape(a.key(),ss);
                    Json val(json_object_arg);
                    val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::add_name());
                    val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                    val.insert_or_assign(jsonpatch_names<char_type>::value_name(), a.value());
                    result.push_back(std::move(val));
                }
            }
        }
        else
        {
            Json val(json_object_arg);
            val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::replace_name());
            val.insert_or_assign(jsonpatch_names<char_type>::path_name(), path);
            val.insert_or_assign(jsonpatch_names<char_type>::value_name(), target);
            result.push_back(std::move(val));
        }

        return result;
    }